

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::iterator::updateParentBounds
          (iterator *this,uint32_t level,interval<unsigned_long> *key)

{
  pointer pEVar1;
  long lVar2;
  ulong uVar3;
  ulong *puVar4;
  
  if (level != 0) {
    pEVar1 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    lVar2 = (ulong)level << 4;
    do {
      uVar3 = (ulong)*(uint *)((long)pEVar1 + lVar2 + -4);
      if (lVar2 == 0x10) {
        puVar4 = (ulong *)((long)pEVar1->node + uVar3 * 0x10 + 0x28);
      }
      else {
        puVar4 = (ulong *)(uVar3 * 0x10 + *(long *)((long)&pEVar1[-1].node + lVar2) + 0x40);
      }
      uVar3 = *puVar4;
      if (key->left < *puVar4) {
        uVar3 = key->left;
      }
      *puVar4 = uVar3;
      uVar3 = key->right;
      if (key->right < puVar4[1]) {
        uVar3 = puVar4[1];
      }
      puVar4[1] = uVar3;
      lVar2 = lVar2 + -0x10;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::updateParentBounds(
    uint32_t level, const IntervalMapDetails::interval<TKey>& key) {
    auto& path = this->path;
    while (level) {
        --level;
        auto offset = path.offset(level);
        auto& existing = level == 0 ? path.template node<RootBranch>(level).keyAt(offset)
                                    : path.template node<Branch>(level).keyAt(offset);
        existing.unionWith(key);
    }
}